

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O3

double xc_bessel_I0_scaled(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = ABS(x);
  if (2.9802322387695312e-08 <= dVar4) {
    if (dVar4 <= 3.0) {
      dVar4 = exp(-dVar4);
      dVar5 = (x * x) / 4.5 + -1.0;
      uVar1 = 0xd;
      dVar2 = 0.0;
      dVar3 = 0.0;
      do {
        dVar6 = dVar3;
        dVar3 = dVar2;
        dVar2 = ((dVar5 + dVar5) * dVar3 - dVar6) + (double)(&DAT_01091960)[uVar1];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
      dVar4 = dVar4 * ((dVar2 - dVar6) * 0.5 + 2.75);
    }
    else {
      if (dVar4 <= 8.0) {
        dVar5 = (48.0 / dVar4 + -11.0) / 5.0;
        uVar1 = 0x16;
        dVar2 = 0.0;
        dVar3 = 0.0;
        do {
          dVar6 = dVar3;
          dVar3 = dVar2;
          dVar2 = ((dVar5 + dVar5) * dVar3 - dVar6) + bi0_data[uVar1 + 10];
          uVar1 = uVar1 - 1;
        } while (1 < uVar1);
      }
      else {
        dVar5 = 16.0 / dVar4 + -1.0;
        uVar1 = 0x17;
        dVar2 = 0.0;
        dVar3 = 0.0;
        do {
          dVar6 = dVar3;
          dVar3 = dVar2;
          dVar2 = ((dVar5 + dVar5) * dVar3 - dVar6) + ai0_data[uVar1 + 0x14];
          uVar1 = uVar1 - 1;
        } while (1 < uVar1);
      }
      dVar4 = ((dVar2 - dVar6) * 0.5 + 0.375) / SQRT(dVar4);
    }
  }
  else {
    dVar4 = 1.0 - dVar4;
  }
  return dVar4;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0_scaled(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0 - y;
  else if(y <= 3.0)
    r = exp(-y)*(2.75 + xc_cheb_eval(y*y/4.5-1.0, bi0_data, 12));
  else if(y <= 8.0)
    r = (.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai0_data, 21))/sqrt(y);
  else
    r = (.375 + xc_cheb_eval(16.0/y - 1.0, ai02_data, 22))/sqrt(y);

  return r;
}